

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_decl_align(CPState *cp,CPDecl *decl)

{
  uint uVar1;
  CTSize CVar2;
  uint uVar3;
  
  uVar3 = 0x40001;
  if (cp->tok == 0x28) {
    CVar2 = cp_decl_sizeattr(cp);
    uVar1 = 0x1f;
    if (CVar2 != 0) {
      for (; CVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar3 = 1;
    if (CVar2 != 0) {
      uVar3 = (~uVar1 & 0xf) << 0x10 ^ 0xf0001;
    }
  }
  decl->attr = decl->attr & 0xfff0fffe | uVar3;
  return;
}

Assistant:

static void cp_decl_align(CPState *cp, CPDecl *decl)
{
  CTSize al = 4;  /* Unspecified alignment is 16 bytes. */
  if (cp->tok == '(') {
    al = cp_decl_sizeattr(cp);
    al = al ? lj_fls(al) : 0;
  }
  CTF_INSERT(decl->attr, ALIGN, al);
  decl->attr |= CTFP_ALIGNED;
}